

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::declare_undefined_values(CompilerMSL *this)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  Variant *pVVar3;
  SPIRUndef *pSVar4;
  SPIRType *pSVar5;
  bool bVar6;
  TypedID<(spirv_cross::Types)0> *pTVar7;
  LoopLock LStack_b8;
  string local_b0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    ParsedIR::LoopLock::~LoopLock(&LStack_b8);
  }
  else {
    pTVar7 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[0xc].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar1 = pTVar7 + sVar2;
    bVar6 = false;
    do {
      while( true ) {
        pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar3[pTVar7->id].type == TypeUndef) break;
LAB_002a5471:
        pTVar7 = pTVar7 + 1;
        if (pTVar7 == pTVar1) {
          ParsedIR::LoopLock::~LoopLock(&LStack_b8);
          if (!bVar6) {
            return;
          }
          goto LAB_002a5578;
        }
      }
      pSVar4 = Variant::get<spirv_cross::SPIRUndef>(pVVar3 + pTVar7->id);
      pSVar5 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(pSVar4->super_IVariant).field_0xc);
      if (*(int *)&(pSVar5->super_IVariant).field_0xc == 1) goto LAB_002a5471;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                (local_90,this,(ulong)(pSVar4->super_IVariant).self.id,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1b])
                (&local_70,this,pSVar5,local_90,(ulong)(pSVar4->super_IVariant).self.id);
      local_b0.field_2._M_allocated_capacity = 0x746e6174736e6f63;
      local_b0._M_string_length = 8;
      local_b0.field_2._M_local_buf[8] = '\0';
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      inject_top_level_storage_qualifier(&local_50,&local_70,&local_b0);
      CompilerGLSL::statement<std::__cxx11::string,char_const(&)[7]>
                (&this->super_CompilerGLSL,&local_50,(char (*) [7])" = {};");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0]);
      }
      pTVar7 = pTVar7 + 1;
      bVar6 = true;
    } while (pTVar7 != pTVar1);
    ParsedIR::LoopLock::~LoopLock(&LStack_b8);
LAB_002a5578:
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x33bad0);
  }
  return;
}

Assistant:

void CompilerMSL::declare_undefined_values()
{
	bool emitted = false;
	ir.for_each_typed_id<SPIRUndef>([&](uint32_t, SPIRUndef &undef) {
		auto &type = this->get<SPIRType>(undef.basetype);
		// OpUndef can be void for some reason ...
		if (type.basetype == SPIRType::Void)
			return;

		statement(inject_top_level_storage_qualifier(
				variable_decl(type, to_name(undef.self), undef.self),
				"constant"),
		          " = {};");
		emitted = true;
	});

	if (emitted)
		statement("");
}